

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::iterate(IsTextureCase *this)

{
  TestLog *log;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  allocator<char> local_135;
  GLuint textureId;
  CallLogWrapper gl;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  code *local_78;
  GLenum local_70;
  ResultCollector result;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118," // ERROR: ",(allocator<char> *)&local_f8);
  tcu::ResultCollector::ResultCollector(&result,log,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  textureId = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGenTextures(&gl,1,&textureId);
  glu::CallLogWrapper::glBindTexture(&gl,this->m_target,textureId);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_135);
    local_78 = glu::getErrorName;
    local_70 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_78);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_f8,&local_98,": ");
    std::operator+(&local_118,&local_f8,"glBindTexture");
    tcu::ResultCollector::fail(&result,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  StateQueryUtil::verifyStateObjectBoolean(&result,&gl,textureId,true,QUERY_ISTEXTURE);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&textureId);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_135);
    local_78 = glu::getErrorName;
    local_70 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_78);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_f8,&local_98,": ");
    std::operator+(&local_118,&local_f8,"glDeleteTextures");
    tcu::ResultCollector::fail(&result,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  StateQueryUtil::verifyStateObjectBoolean(&result,&gl,textureId,false,QUERY_ISTEXTURE);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

IsTextureCase::IterateResult IsTextureCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_renderCtx.getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	glw::GLuint				textureId	= 0;

	gl.enableLogging(true);

	gl.glGenTextures(1, &textureId);
	gl.glBindTexture(m_target, textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

	verifyStateObjectBoolean(result, gl, textureId, true, QUERY_ISTEXTURE);

	gl.glDeleteTextures(1, &textureId);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");

	verifyStateObjectBoolean(result, gl, textureId, false, QUERY_ISTEXTURE);

	result.setTestContextResult(m_testCtx);
	return STOP;
}